

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_expr.hpp
# Opt level: O1

rt_expr<viennamath::rt_expression_interface<double>_>
viennamath::operator*
          (rt_vector_expr<viennamath::rt_expression_interface<double>_> *lhs,
          rt_vector_expr<viennamath::rt_expression_interface<double>_> *rhs)

{
  undefined8 *puVar1;
  int iVar2;
  rt_expression_interface<double> *prVar3;
  op_interface<viennamath::rt_expression_interface<double>_> *poVar4;
  long *plVar5;
  long *plVar6;
  undefined4 extraout_var;
  long lVar7;
  long in_RDX;
  rt_binary_expr<viennamath::rt_expression_interface<double>_> *other;
  void *in_R8;
  ulong uVar8;
  long lVar9;
  undefined1 auVar10 [16];
  rt_expr<viennamath::rt_expression_interface<double>_> *result;
  rt_binary_expr<viennamath::rt_expression_interface<double>_> local_78;
  undefined **local_58;
  long *local_50;
  long *local_48;
  long *local_40;
  rt_vector_expr<viennamath::rt_expression_interface<double>_> *local_38;
  
  lVar7 = *(long *)(rhs + 0x10) - (long)*(undefined8 **)(rhs + 8);
  local_38 = rhs;
  if (lVar7 != 0) {
    puVar1 = *(undefined8 **)(in_RDX + 8);
    if (lVar7 == *(long *)(in_RDX + 0x10) - (long)puVar1) {
      prVar3 = (rt_expression_interface<double> *)
               (**(code **)(*(long *)**(undefined8 **)(rhs + 8) + 0x10))();
      poVar4 = (op_interface<viennamath::rt_expression_interface<double>_> *)operator_new(8);
      poVar4->_vptr_op_interface = (_func_int **)&PTR__op_interface_0011e538;
      local_78.rhs_._M_ptr =
           (rt_expression_interface<double> *)(**(code **)(*(long *)*puVar1 + 0x10))();
      other = &local_78;
      local_78.super_rt_expression_interface<double>._vptr_rt_expression_interface =
           (_func_int **)&PTR__rt_binary_expr_0011e158;
      local_78.lhs_._M_ptr = prVar3;
      local_78.op_._M_ptr = poVar4;
      rt_expr<viennamath::rt_expression_interface<double>_>::rt_expr
                ((rt_expr<viennamath::rt_expression_interface<double>_> *)lhs,other);
      local_78.super_rt_expression_interface<double>._vptr_rt_expression_interface =
           (_func_int **)&PTR__rt_binary_expr_0011e158;
      if (local_78.rhs_._M_ptr != (rt_expression_interface<double> *)0x0) {
        (*(local_78.rhs_._M_ptr)->_vptr_rt_expression_interface[1])();
      }
      if (local_78.op_._M_ptr != (op_interface<viennamath::rt_expression_interface<double>_> *)0x0)
      {
        (*(local_78.op_._M_ptr)->_vptr_op_interface[1])();
      }
      if (local_78.lhs_._M_ptr != (rt_expression_interface<double> *)0x0) {
        (*(local_78.lhs_._M_ptr)->_vptr_rt_expression_interface[1])();
      }
      lVar9 = *(long *)(in_RDX + 8);
      if (8 < (ulong)(*(long *)(in_RDX + 0x10) - lVar9)) {
        uVar8 = 1;
        do {
          plVar5 = (long *)(**(code **)(**(long **)(*(long *)(local_38 + 8) + uVar8 * 8) + 0x10))();
          plVar6 = (long *)operator_new(8);
          *plVar6 = (long)&PTR__op_interface_0011e538;
          local_40 = (long *)(**(code **)(**(long **)(lVar9 + uVar8 * 8) + 0x10))();
          local_58 = &PTR__rt_binary_expr_0011e158;
          local_50 = plVar5;
          local_48 = plVar6;
          prVar3 = (rt_expression_interface<double> *)(**(code **)(**(long **)lhs + 0x10))();
          poVar4 = (op_interface<viennamath::rt_expression_interface<double>_> *)operator_new(8);
          poVar4->_vptr_op_interface = (_func_int **)&PTR__op_interface_0011e2d8;
          auVar10 = (*(code *)local_58[2])(&local_58);
          local_78.rhs_._M_ptr = auVar10._0_8_;
          local_78.super_rt_expression_interface<double>._vptr_rt_expression_interface =
               (_func_int **)&PTR__rt_binary_expr_0011e158;
          local_78.lhs_._M_ptr = prVar3;
          local_78.op_._M_ptr = poVar4;
          iVar2 = rt_binary_expr<viennamath::rt_expression_interface<double>_>::clone
                            (&local_78,(__fn *)other,auVar10._8_8_,(int)lVar7,in_R8);
          plVar5 = *(long **)lhs;
          if (plVar5 != (long *)CONCAT44(extraout_var,iVar2)) {
            if (plVar5 != (long *)0x0) {
              (**(code **)(*plVar5 + 8))();
            }
            *(long **)lhs = (long *)CONCAT44(extraout_var,iVar2);
          }
          local_78.super_rt_expression_interface<double>._vptr_rt_expression_interface =
               (_func_int **)&PTR__rt_binary_expr_0011e158;
          if (local_78.rhs_._M_ptr != (rt_expression_interface<double> *)0x0) {
            (*(local_78.rhs_._M_ptr)->_vptr_rt_expression_interface[1])();
          }
          if (local_78.op_._M_ptr !=
              (op_interface<viennamath::rt_expression_interface<double>_> *)0x0) {
            (*(local_78.op_._M_ptr)->_vptr_op_interface[1])();
          }
          if (local_78.lhs_._M_ptr != (rt_expression_interface<double> *)0x0) {
            (*(local_78.lhs_._M_ptr)->_vptr_rt_expression_interface[1])();
          }
          local_58 = &PTR__rt_binary_expr_0011e158;
          if (local_40 != (long *)0x0) {
            (**(code **)(*local_40 + 8))();
          }
          if (local_48 != (long *)0x0) {
            (**(code **)(*local_48 + 8))();
          }
          if (local_50 != (long *)0x0) {
            (**(code **)(*local_50 + 8))();
          }
          uVar8 = uVar8 + 1;
          lVar9 = *(long *)(in_RDX + 8);
        } while (uVar8 < (ulong)(*(long *)(in_RDX + 0x10) - lVar9 >> 3));
      }
      return (rt_expr<viennamath::rt_expression_interface<double>_>)
             (auto_ptr<const_viennamath::rt_expression_interface<double>_>)lhs;
    }
  }
  __assert_fail("lhs.size() == rhs.size() && lhs.size() > 0 && \"Invalid or nonmatching size in expression vectors\""
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/viennamath[P]viennamath-dev/viennamath/runtime/vector_expr.hpp"
                ,0x10e,
                "rt_expr<InterfaceType> viennamath::operator*(const rt_vector_expr<InterfaceType> &, const rt_vector_expr<InterfaceType> &) [InterfaceType = viennamath::rt_expression_interface<double>]"
               );
}

Assistant:

rt_expr<InterfaceType> operator*(rt_vector_expr<InterfaceType> const & lhs, rt_vector_expr<InterfaceType> const & rhs)
  {
    assert(lhs.size() == rhs.size() && lhs.size() > 0 && "Invalid or nonmatching size in expression vectors");

    rt_expr<InterfaceType> result = lhs[0] * rhs[0];
    for (std::size_t i=1; i<rhs.size(); ++i)
      result = result + lhs[i] * rhs[i];

    return result;
  }